

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall amrex::AmrLevel::restart(AmrLevel *this,Amr *papa,istream *is,bool bReadSpecial)

{
  BoxArray *this_00;
  int iVar1;
  int iVar2;
  Amr *pAVar3;
  pointer pIVar4;
  FabFactory<amrex::FArrayBox> *pFVar5;
  pointer pSVar6;
  FabFactory<amrex::FArrayBox> *pFVar7;
  pointer piVar8;
  uint uVar9;
  long lVar10;
  IndexSpace *pIVar11;
  StateDescriptor *d;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  initializer_list<int> __l;
  allocator_type local_a9;
  FabFactory<amrex::FArrayBox> *local_a8;
  BoxArray *local_a0;
  DistributionMapping *local_98;
  Amr *local_90;
  _Vector_base<int,_std::allocator<int>_> local_88;
  Box *local_70;
  BoxArray *local_68;
  int nstate;
  Vector<int,_std::allocator<int>_> state_in_checkpoint;
  int local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  this->parent = papa;
  local_90 = papa;
  std::istream::operator>>((istream *)is,&this->level);
  local_a0 = (BoxArray *)&this->geom;
  amrex::operator>>(is,(Geometry *)local_a0);
  (this->fine_ratio).vect[0] = -1;
  (this->fine_ratio).vect[1] = -1;
  (this->fine_ratio).vect[2] = -1;
  (this->crse_ratio).vect[0] = -1;
  (this->crse_ratio).vect[1] = -1;
  (this->crse_ratio).vect[2] = -1;
  iVar1 = this->level;
  lVar10 = (long)iVar1;
  pAVar3 = this->parent;
  if (0 < lVar10) {
    pIVar4 = (pAVar3->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = pIVar4[lVar10 + -1].vect[2];
    *(undefined8 *)(this->crse_ratio).vect = *(undefined8 *)pIVar4[lVar10 + -1].vect;
    (this->crse_ratio).vect[2] = iVar2;
  }
  if (iVar1 < (pAVar3->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    pIVar4 = (pAVar3->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = pIVar4[lVar10].vect[2];
    *(undefined8 *)(this->fine_ratio).vect = *(undefined8 *)pIVar4[lVar10].vect;
    (this->fine_ratio).vect[2] = iVar1;
  }
  this_00 = &this->grids;
  if (bReadSpecial) {
    readBoxArray(this_00,is,true);
  }
  else {
    BoxArray::readFrom(this_00,is);
  }
  std::istream::operator>>((istream *)is,&nstate);
  uVar9 = DescriptorList::size((DescriptorList *)desc_lst);
  local_88._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_88._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::vector<int,_std::allocator<int>_>::vector
            (&state_in_checkpoint.super_vector<int,_std::allocator<int>_>,(long)(int)uVar9,
             (value_type_conflict *)&local_88,(allocator_type *)&local_3c);
  if (nstate < (int)uVar9) {
    (*this->_vptr_AmrLevel[0xc])(this,&state_in_checkpoint);
  }
  local_98 = &this->dmap;
  DistributionMapping::define(local_98,this_00,*(int *)(ParallelContext::frames + 0x10));
  AmrMesh::SetBoxArray((AmrMesh *)this->parent,this->level,this_00);
  AmrMesh::SetDistributionMap((AmrMesh *)this->parent,this->level,local_98);
  pIVar11 = EB2::TopIndexSpaceIfPresent();
  if (pIVar11 == (IndexSpace *)0x0) {
    std::make_unique<amrex::DefaultFabFactory<amrex::FArrayBox>>();
    piVar8 = local_88._M_impl.super__Vector_impl_data._M_start;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pFVar5 = (this->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    (this->m_factory)._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         (FabFactory<amrex::FArrayBox> *)piVar8;
    if (pFVar5 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*pFVar5->_vptr_FabFactory[1])();
      if ((FabFactory<amrex::FArrayBox> *)local_88._M_impl.super__Vector_impl_data._M_start !=
          (FabFactory<amrex::FArrayBox> *)0x0) {
        (*(*(_func_int ***)local_88._M_impl.super__Vector_impl_data._M_start)[1])();
      }
    }
  }
  else {
    local_3c = m_eb_basic_grow_cells;
    local_38 = m_eb_volume_grow_cells;
    local_34 = m_eb_full_grow_cells;
    __l._M_len = 3;
    __l._M_array = &local_3c;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_88,__l,&local_a9);
    makeEBFabFactory((Geometry *)&local_a8,local_a0,(DistributionMapping *)this_00,
                     (Vector<int,_std::allocator<int>_> *)local_98,(EBSupport)&local_88);
    pFVar7 = local_a8;
    local_a8 = (FabFactory<amrex::FArrayBox> *)0x0;
    pFVar5 = (this->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    (this->m_factory)._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl = pFVar7;
    if (pFVar5 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*pFVar5->_vptr_FabFactory[1])();
      if (local_a8 != (FabFactory<amrex::FArrayBox> *)0x0) {
        (**(code **)(*(long *)local_a8 + 8))();
      }
    }
    local_a8 = (FabFactory<amrex::FArrayBox> *)0x0;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  }
  std::vector<amrex::StateData,_std::allocator<amrex::StateData>_>::resize
            (&(this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>,
             (long)(int)uVar9);
  local_70 = &(this->geom).domain;
  local_90 = (Amr *)&local_90->restart_chkfile;
  uVar13 = 0;
  uVar14 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar14 = uVar13;
  }
  local_a0 = (BoxArray *)is;
  local_68 = this_00;
  for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
    if (state_in_checkpoint.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar12] != 0) {
      pSVar6 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      pFVar5 = (this->m_factory)._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
      d = DescriptorList::operator[]((DescriptorList *)desc_lst,(int)uVar12);
      StateData::restart((StateData *)((long)(pSVar6->domain).smallend.vect + uVar13 + -0x10),
                         (istream *)local_a0,local_70,local_68,local_98,pFVar5,d,(string *)local_90)
      ;
    }
    uVar13 = uVar13 + 0xe0;
  }
  if ((this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids != false) {
    constructAreaNotToTag(this);
  }
  this->post_step_regrid = 0;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&state_in_checkpoint);
  return;
}

Assistant:

void
AmrLevel::restart (Amr&          papa,
                   std::istream& is,
                   bool          bReadSpecial)
{
    BL_PROFILE("AmrLevel::restart()");
    parent = &papa;

    is >> level;
    is >> geom;

    fine_ratio = IntVect::TheUnitVector(); fine_ratio.scale(-1);
    crse_ratio = IntVect::TheUnitVector(); crse_ratio.scale(-1);

    if (level > 0)
    {
        crse_ratio = parent->refRatio(level-1);
    }
    if (level < parent->maxLevel())
    {
        fine_ratio = parent->refRatio(level);
    }

    if (bReadSpecial)
    {
        amrex::readBoxArray(grids, is, bReadSpecial);
    }
    else
    {
        grids.readFrom(is);
    }

    int nstate;
    is >> nstate;
    int ndesc = desc_lst.size();

    Vector<int> state_in_checkpoint(ndesc, 1);
    if (ndesc > nstate) {
        set_state_in_checkpoint(state_in_checkpoint);
    } else {
        BL_ASSERT(nstate == ndesc);
    }

    dmap.define(grids);

    parent->SetBoxArray(level, grids);
    parent->SetDistributionMap(level, dmap);

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        m_factory = makeEBFabFactory(geom, grids, dmap,
                                     {m_eb_basic_grow_cells,
                                      m_eb_volume_grow_cells,
                                      m_eb_full_grow_cells},
                                     m_eb_support_level);
    } else
#endif
    {
        m_factory = std::make_unique<FArrayBoxFactory>();
    }

    state.resize(ndesc);
    for (int i = 0; i < ndesc; ++i)
    {
        if (state_in_checkpoint[i]) {
            state[i].restart(is, geom.Domain(), grids, dmap, *m_factory,
                             desc_lst[i], papa.theRestartFile());
        }
    }

    if (parent->useFixedCoarseGrids()) constructAreaNotToTag();

    post_step_regrid = 0;

    finishConstructor();
}